

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O2

void __thiscall
wasm::ParamUtils::localizeCallsTo(std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::
equal_to<wasm::Name>,std::allocator<wasm::Name>>const&,wasm::Module&,wasm::PassRunner*,std::
function<void(wasm::Function*)>)::LocalizerPass::LocalizerPass(std::unordered_set<wasm::Name,std::
hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>const&,std::function<void(wasm
::Function__>_(void *this,
              unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
              *callTargets,function<void_(wasm::Function_*)> *onChange)

{
  *(undefined8 *)((long)this + 8) = 0;
  *(long *)((long)this + 0x10) = (long)this + 0x20;
  *(undefined8 *)((long)this + 0x18) = 0;
  *(undefined1 *)((long)this + 0x20) = 0;
  *(undefined1 *)((long)this + 0x50) = 0;
  *(undefined8 *)((long)this + 0x58) = 0;
  *(undefined8 *)((long)this + 0x60) = 0;
  *(undefined8 *)((long)this + 0x108) = 0;
  *(undefined8 *)((long)this + 0x110) = 0;
  *(undefined8 *)((long)this + 0x118) = 0;
  *(undefined8 *)((long)this + 0x120) = 0;
  *(undefined8 *)((long)this + 0x128) = 0;
  *(undefined ***)this = &PTR__LocalizerPass_0111f530;
  *(unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    **)((long)this + 0x130) = callTargets;
  std::function<void_(wasm::Function_*)>::function
            ((function<void_(wasm::Function_*)> *)((long)this + 0x138),onChange);
  *(undefined1 *)((long)this + 0x158) = 0;
  return;
}

Assistant:

LocalizerPass(const std::unordered_set<Name>& callTargets,
                  std::function<void(Function*)> onChange)
      : callTargets(callTargets), onChange(onChange) {}